

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_haxe_generator.cc
# Opt level: O2

void __thiscall
t_haxe_generator::generate_deserialize_container
          (t_haxe_generator *this,ostream *out,t_type *ttype,string *prefix)

{
  int iVar1;
  ostream *poVar2;
  char *pcVar3;
  string *psVar4;
  string i;
  string obj;
  allocator local_149;
  string local_148;
  undefined1 *local_128;
  undefined8 local_120;
  undefined1 local_118 [16];
  string local_108;
  string local_e8;
  string local_c8;
  string local_a8;
  string local_88;
  string local_68;
  string local_48;
  
  t_oop_generator::scope_up(&this->super_t_oop_generator,out);
  local_128 = local_118;
  local_120 = 0;
  local_118[0] = 0;
  iVar1 = (*(ttype->super_t_doc)._vptr_t_doc[0x10])(ttype);
  if ((char)iVar1 == '\0') {
    iVar1 = (*(ttype->super_t_doc)._vptr_t_doc[0xf])(ttype);
    if ((char)iVar1 != '\0') {
      std::__cxx11::string::string((string *)&local_c8,"_set",&local_149);
      t_generator::tmp(&local_148,(t_generator *)this,&local_c8);
      std::__cxx11::string::operator=((string *)&local_128,(string *)&local_148);
      std::__cxx11::string::~string((string *)&local_148);
      psVar4 = &local_c8;
      goto LAB_001e7b64;
    }
    iVar1 = (*(ttype->super_t_doc)._vptr_t_doc[0xe])(ttype);
    if ((char)iVar1 != '\0') {
      std::__cxx11::string::string((string *)&local_e8,"_list",&local_149);
      t_generator::tmp(&local_148,(t_generator *)this,&local_e8);
      std::__cxx11::string::operator=((string *)&local_128,(string *)&local_148);
      std::__cxx11::string::~string((string *)&local_148);
      psVar4 = &local_e8;
      goto LAB_001e7b64;
    }
  }
  else {
    std::__cxx11::string::string((string *)&local_a8,"_map",&local_149);
    t_generator::tmp(&local_148,(t_generator *)this,&local_a8);
    std::__cxx11::string::operator=((string *)&local_128,(string *)&local_148);
    std::__cxx11::string::~string((string *)&local_148);
    psVar4 = &local_a8;
LAB_001e7b64:
    std::__cxx11::string::~string((string *)psVar4);
  }
  iVar1 = (*(ttype->super_t_doc)._vptr_t_doc[0x10])(ttype);
  if ((char)iVar1 == '\0') {
    iVar1 = (*(ttype->super_t_doc)._vptr_t_doc[0xf])(ttype);
    if ((char)iVar1 != '\0') {
      poVar2 = t_generator::indent((t_generator *)this,out);
      poVar2 = std::operator<<(poVar2,"var ");
      poVar2 = std::operator<<(poVar2,(string *)&local_128);
      pcVar3 = " = iprot.readSetBegin();";
      goto LAB_001e7c21;
    }
    iVar1 = (*(ttype->super_t_doc)._vptr_t_doc[0xe])(ttype);
    if ((char)iVar1 != '\0') {
      poVar2 = t_generator::indent((t_generator *)this,out);
      poVar2 = std::operator<<(poVar2,"var ");
      poVar2 = std::operator<<(poVar2,(string *)&local_128);
      pcVar3 = " = iprot.readListBegin();";
      goto LAB_001e7c21;
    }
  }
  else {
    poVar2 = t_generator::indent((t_generator *)this,out);
    poVar2 = std::operator<<(poVar2,"var ");
    poVar2 = std::operator<<(poVar2,(string *)&local_128);
    pcVar3 = " = iprot.readMapBegin();";
LAB_001e7c21:
    poVar2 = std::operator<<(poVar2,pcVar3);
    std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  }
  poVar2 = t_generator::indent((t_generator *)this,out);
  poVar2 = std::operator<<(poVar2,(string *)prefix);
  poVar2 = std::operator<<(poVar2," = new ");
  type_name_abi_cxx11_(&local_148,this,ttype,false,false);
  poVar2 = std::operator<<(poVar2,(string *)&local_148);
  poVar2 = std::operator<<(poVar2,"(");
  poVar2 = std::operator<<(poVar2,");");
  std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_148);
  std::__cxx11::string::string((string *)&local_108,"_i",&local_149);
  t_generator::tmp(&local_148,(t_generator *)this,&local_108);
  std::__cxx11::string::~string((string *)&local_108);
  poVar2 = t_generator::indent((t_generator *)this,out);
  poVar2 = std::operator<<(poVar2,"for( ");
  poVar2 = std::operator<<(poVar2,(string *)&local_148);
  poVar2 = std::operator<<(poVar2," in 0 ... ");
  poVar2 = std::operator<<(poVar2,(string *)&local_128);
  poVar2 = std::operator<<(poVar2,".size)");
  std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  t_oop_generator::scope_up(&this->super_t_oop_generator,out);
  iVar1 = (*(ttype->super_t_doc)._vptr_t_doc[0x10])(ttype);
  if ((char)iVar1 == '\0') {
    iVar1 = (*(ttype->super_t_doc)._vptr_t_doc[0xf])(ttype);
    if ((char)iVar1 != '\0') {
      psVar4 = &local_68;
      std::__cxx11::string::string((string *)psVar4,(string *)prefix);
      generate_deserialize_set_element(this,out,(t_set *)ttype,psVar4);
      goto LAB_001e7df1;
    }
    iVar1 = (*(ttype->super_t_doc)._vptr_t_doc[0xe])(ttype);
    if ((char)iVar1 != '\0') {
      psVar4 = &local_88;
      std::__cxx11::string::string((string *)psVar4,(string *)prefix);
      generate_deserialize_list_element(this,out,(t_list *)ttype,psVar4);
      goto LAB_001e7df1;
    }
  }
  else {
    psVar4 = &local_48;
    std::__cxx11::string::string((string *)psVar4,(string *)prefix);
    generate_deserialize_map_element(this,out,(t_map *)ttype,psVar4);
LAB_001e7df1:
    std::__cxx11::string::~string((string *)psVar4);
  }
  t_oop_generator::scope_down(&this->super_t_oop_generator,out);
  iVar1 = (*(ttype->super_t_doc)._vptr_t_doc[0x10])(ttype);
  if ((char)iVar1 == '\0') {
    iVar1 = (*(ttype->super_t_doc)._vptr_t_doc[0xf])(ttype);
    if ((char)iVar1 == '\0') {
      iVar1 = (*(ttype->super_t_doc)._vptr_t_doc[0xe])(ttype);
      if ((char)iVar1 == '\0') goto LAB_001e7e7f;
      poVar2 = t_generator::indent((t_generator *)this,out);
      pcVar3 = "iprot.readListEnd();";
    }
    else {
      poVar2 = t_generator::indent((t_generator *)this,out);
      pcVar3 = "iprot.readSetEnd();";
    }
  }
  else {
    poVar2 = t_generator::indent((t_generator *)this,out);
    pcVar3 = "iprot.readMapEnd();";
  }
  poVar2 = std::operator<<(poVar2,pcVar3);
  std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
LAB_001e7e7f:
  t_oop_generator::scope_down(&this->super_t_oop_generator,out);
  std::__cxx11::string::~string((string *)&local_148);
  std::__cxx11::string::~string((string *)&local_128);
  return;
}

Assistant:

void t_haxe_generator::generate_deserialize_container(ostream& out, t_type* ttype, string prefix) {
  scope_up(out);

  string obj;

  if (ttype->is_map()) {
    obj = tmp("_map");
  } else if (ttype->is_set()) {
    obj = tmp("_set");
  } else if (ttype->is_list()) {
    obj = tmp("_list");
  }

  // Declare variables, read header
  if (ttype->is_map()) {
    indent(out) << "var " << obj << " = iprot.readMapBegin();" << endl;
  } else if (ttype->is_set()) {
    indent(out) << "var " << obj << " = iprot.readSetBegin();" << endl;
  } else if (ttype->is_list()) {
    indent(out) << "var " << obj << " = iprot.readListBegin();" << endl;
  }

  indent(out) << prefix << " = new " << type_name(ttype, false, true)
              // size the collection correctly
              << "("
              << ");" << endl;

  // For loop iterates over elements
  string i = tmp("_i");
  indent(out) << "for( " << i << " in 0 ... " << obj << ".size)" << endl;

  scope_up(out);

  if (ttype->is_map()) {
    generate_deserialize_map_element(out, (t_map*)ttype, prefix);
  } else if (ttype->is_set()) {
    generate_deserialize_set_element(out, (t_set*)ttype, prefix);
  } else if (ttype->is_list()) {
    generate_deserialize_list_element(out, (t_list*)ttype, prefix);
  }

  scope_down(out);

  // Read container end
  if (ttype->is_map()) {
    indent(out) << "iprot.readMapEnd();" << endl;
  } else if (ttype->is_set()) {
    indent(out) << "iprot.readSetEnd();" << endl;
  } else if (ttype->is_list()) {
    indent(out) << "iprot.readListEnd();" << endl;
  }

  scope_down(out);
}